

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<double,_std::allocator<double>_> *v)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  double *pdVar3;
  char *pcVar4;
  size_t sVar5;
  double *el;
  double *pdVar6;
  int iVar7;
  bool bVar8;
  FormatSpec local_48;
  
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar5 = pBVar2->size_;
  if (sVar5 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar5 + 1);
    sVar5 = pBVar2->size_;
  }
  pBVar2->size_ = sVar5 + 1;
  pBVar2->ptr_[sVar5] = '[';
  pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar6 != pdVar3) {
    iVar7 = 0;
    do {
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar8) {
        pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
        sVar5 = pBVar2->size_;
        uVar1 = sVar5 + 2;
        if (pBVar2->capacity_ < uVar1) {
          (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
          sVar5 = pBVar2->size_;
        }
        pcVar4 = pBVar2->ptr_;
        (pcVar4 + sVar5)[0] = ',';
        (pcVar4 + sVar5)[1] = ' ';
        pBVar2->size_ = uVar1;
      }
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,*pdVar6,&local_48);
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != pdVar3);
  }
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar5 = pBVar2->size_;
  if (sVar5 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar5 + 1);
    sVar5 = pBVar2->size_;
  }
  pBVar2->size_ = sVar5 + 1;
  pBVar2->ptr_[sVar5] = ']';
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const Vec& v) {
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << el;
  }
  wrt << ']';
}